

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Tracks::Write(Tracks *this,IMkvWriter *writer)

{
  Track *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  int32_t i;
  ulong uVar5;
  ulong uVar6;
  uint64 size;
  
  uVar5 = 0;
  uVar6 = (ulong)this->track_entries_size_;
  if ((int)this->track_entries_size_ < 1) {
    uVar6 = uVar5;
  }
  size = 0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if (this->track_entries_ == (Track **)0x0) {
      return false;
    }
    if (this->track_entries_size_ <= uVar5) {
      return false;
    }
    pTVar1 = this->track_entries_[uVar5];
    if (pTVar1 == (Track *)0x0) {
      return false;
    }
    iVar3 = (*pTVar1->_vptr_Track[4])();
    size = size + CONCAT44(extraout_var,iVar3);
  }
  bVar2 = WriteEbmlMasterElement(writer,0x1654ae6b,size);
  if (bVar2) {
    iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
    if (-1 < extraout_var_00) {
      uVar5 = 0;
      do {
        if (uVar6 == uVar5) {
          iVar4 = (*writer->_vptr_IMkvWriter[1])(writer);
          if (extraout_var_01 < 0) {
            return false;
          }
          if (CONCAT44(extraout_var_01,iVar4) - CONCAT44(extraout_var_00,iVar3) == size) {
            this->wrote_tracks_ = true;
            return true;
          }
          return false;
        }
        iVar4 = (*this->track_entries_[uVar5]->_vptr_Track[5])(this->track_entries_[uVar5],writer);
        uVar5 = uVar5 + 1;
      } while ((char)iVar4 != '\0');
    }
  }
  return false;
}

Assistant:

bool Tracks::Write(IMkvWriter* writer) const {
  uint64_t size = 0;
  const int32_t count = track_entries_size();
  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);

    if (!track)
      return false;

    size += track->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTracks, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);
    if (!track->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  wrote_tracks_ = true;
  return true;
}